

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  size_t k;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  byte bVar27;
  bool bVar28;
  int iVar29;
  uint uVar30;
  float *vertices;
  long lVar31;
  long lVar32;
  undefined1 (*pauVar33) [32];
  ulong uVar34;
  ulong uVar35;
  ulong *puVar36;
  NodeRef root;
  size_t i_1;
  long lVar37;
  undefined4 uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar77 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar78 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vuint<4> *v;
  TravRayK<8,_true> tray;
  vfloat<8> t;
  vfloat<8> v_1;
  vfloat<8> u;
  Vec3vf<8> Ng;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5dcc;
  Precalculations local_5db9;
  ulong local_5db8;
  RayK<8> *local_5db0;
  RayQueryContext *local_5da8;
  undefined4 local_5d9c;
  uint local_5d98;
  undefined4 local_5d94;
  RayK<8> *local_5d90;
  Geometry *local_5d88;
  RTCFilterFunctionNArguments local_5d80;
  BVH *local_5d50;
  Intersectors *local_5d48;
  long local_5d40;
  long local_5d38;
  Scene *local_5d30;
  long local_5d28;
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [32];
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 local_5cb0;
  undefined8 uStack_5ca8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ca0;
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  int local_5b80;
  int iStack_5b7c;
  int iStack_5b78;
  int iStack_5b74;
  int iStack_5b70;
  int iStack_5b6c;
  int iStack_5b68;
  int iStack_5b64;
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  uint local_5b40;
  uint uStack_5b3c;
  uint uStack_5b38;
  uint uStack_5b34;
  uint uStack_5b30;
  uint uStack_5b2c;
  uint uStack_5b28;
  uint uStack_5b24;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ac0;
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [8];
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  undefined1 local_5a20 [8];
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a00;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5980;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  uint local_5920;
  uint uStack_591c;
  uint uStack_5918;
  uint uStack_5914;
  uint uStack_5910;
  uint uStack_590c;
  uint uStack_5908;
  uint uStack_5904;
  uint local_5900;
  uint uStack_58fc;
  uint uStack_58f8;
  uint uStack_58f4;
  uint uStack_58f0;
  uint uStack_58ec;
  uint uStack_58e8;
  uint uStack_58e4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58e0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58c0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_58a0;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5860;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d50 = (BVH *)This->ptr;
  local_5808 = (local_5d50->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar41 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar76 = ZEXT816(0) << 0x40;
      uVar40 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar76),5);
      uVar39 = vpcmpeqd_avx512vl(auVar41,(undefined1  [32])valid_i->field_0);
      uVar40 = uVar40 & uVar39;
      bVar27 = (byte)uVar40;
      if (bVar27 != 0) {
        local_5ca0._0_8_ = *(undefined8 *)ray;
        local_5ca0._8_8_ = *(undefined8 *)(ray + 8);
        local_5ca0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5ca0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5ca0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5ca0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5ca0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5ca0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5ca0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5ca0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5ca0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5ca0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5c40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5c20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5c00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar81 = ZEXT3264(auVar41);
        vandps_avx512vl(local_5c40,auVar41);
        auVar67._8_4_ = 0x219392ef;
        auVar67._0_8_ = 0x219392ef219392ef;
        auVar67._12_4_ = 0x219392ef;
        auVar67._16_4_ = 0x219392ef;
        auVar67._20_4_ = 0x219392ef;
        auVar67._24_4_ = 0x219392ef;
        auVar67._28_4_ = 0x219392ef;
        uVar39 = vcmpps_avx512vl(auVar41,auVar67,1);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar82 = ZEXT3264(auVar42);
        auVar43 = vdivps_avx512vl(auVar42,local_5c40);
        vandps_avx512vl(local_5c20,auVar41);
        uVar35 = vcmpps_avx512vl(auVar43,auVar67,1);
        auVar44 = vdivps_avx512vl(auVar42,local_5c20);
        vandps_avx512vl(local_5c00,auVar41);
        uVar19 = vcmpps_avx512vl(auVar44,auVar67,1);
        auVar41 = vdivps_avx512vl(auVar42,local_5c00);
        auVar77 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                     CONCAT424(0x5d5e0b6b,
                                               CONCAT420(0x5d5e0b6b,
                                                         CONCAT416(0x5d5e0b6b,
                                                                   CONCAT412(0x5d5e0b6b,
                                                                             CONCAT48(0x5d5e0b6b,
                                                                                                                                                                            
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar28 = (bool)((byte)uVar39 & 1);
        local_5be0._0_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._0_4_;
        bVar28 = (bool)((byte)(uVar39 >> 1) & 1);
        local_5be0._4_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._4_4_;
        bVar28 = (bool)((byte)(uVar39 >> 2) & 1);
        fStack_5bd8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._8_4_);
        bVar28 = (bool)((byte)(uVar39 >> 3) & 1);
        fStack_5bd4 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._12_4_);
        bVar28 = (bool)((byte)(uVar39 >> 4) & 1);
        fStack_5bd0 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._16_4_);
        bVar28 = (bool)((byte)(uVar39 >> 5) & 1);
        fStack_5bcc = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._20_4_);
        bVar28 = (bool)((byte)(uVar39 >> 6) & 1);
        fStack_5bc8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._24_4_);
        bVar28 = SUB81(uVar39 >> 7,0);
        register0x00000918 = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._28_4_;
        bVar28 = (bool)((byte)uVar35 & 1);
        local_5bc0._0_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._0_4_;
        bVar28 = (bool)((byte)(uVar35 >> 1) & 1);
        local_5bc0._4_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._4_4_;
        bVar28 = (bool)((byte)(uVar35 >> 2) & 1);
        fStack_5bb8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._8_4_);
        bVar28 = (bool)((byte)(uVar35 >> 3) & 1);
        fStack_5bb4 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._12_4_);
        bVar28 = (bool)((byte)(uVar35 >> 4) & 1);
        fStack_5bb0 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._16_4_);
        bVar28 = (bool)((byte)(uVar35 >> 5) & 1);
        fStack_5bac = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._20_4_);
        bVar28 = (bool)((byte)(uVar35 >> 6) & 1);
        fStack_5ba8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._24_4_);
        bVar28 = SUB81(uVar35 >> 7,0);
        register0x00000918 = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._28_4_;
        bVar28 = (bool)((byte)uVar19 & 1);
        local_5ba0._0_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._0_4_;
        bVar28 = (bool)((byte)(uVar19 >> 1) & 1);
        local_5ba0._4_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._4_4_;
        bVar28 = (bool)((byte)(uVar19 >> 2) & 1);
        fStack_5b98 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._8_4_);
        bVar28 = (bool)((byte)(uVar19 >> 3) & 1);
        fStack_5b94 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._12_4_);
        bVar28 = (bool)((byte)(uVar19 >> 4) & 1);
        fStack_5b90 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._16_4_);
        bVar28 = (bool)((byte)(uVar19 >> 5) & 1);
        fStack_5b8c = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._20_4_);
        bVar28 = (bool)((byte)(uVar19 >> 6) & 1);
        fStack_5b88 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._24_4_);
        bVar28 = SUB81(uVar19 >> 7,0);
        register0x00000918 = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._28_4_;
        uVar39 = vcmpps_avx512vl(_local_5be0,ZEXT1632(auVar76),1);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_5b80 = (uint)((byte)uVar39 & 1) * auVar41._0_4_;
        iStack_5b7c = (uint)((byte)(uVar39 >> 1) & 1) * auVar41._4_4_;
        iStack_5b78 = (uint)((byte)(uVar39 >> 2) & 1) * auVar41._8_4_;
        iStack_5b74 = (uint)((byte)(uVar39 >> 3) & 1) * auVar41._12_4_;
        iStack_5b70 = (uint)((byte)(uVar39 >> 4) & 1) * auVar41._16_4_;
        iStack_5b6c = (uint)((byte)(uVar39 >> 5) & 1) * auVar41._20_4_;
        iStack_5b68 = (uint)((byte)(uVar39 >> 6) & 1) * auVar41._24_4_;
        iStack_5b64 = (uint)(byte)(uVar39 >> 7) * auVar41._28_4_;
        auVar42 = ZEXT1632(auVar76);
        uVar39 = vcmpps_avx512vl(_local_5bc0,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar28 = (bool)((byte)uVar39 & 1);
        bVar6 = (bool)((byte)(uVar39 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar39 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar39 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar39 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar39 >> 6) & 1);
        bVar12 = SUB81(uVar39 >> 7,0);
        local_5b60 = (uint)bVar28 * auVar41._0_4_ | (uint)!bVar28 * 0x60;
        uStack_5b5c = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0x60;
        uStack_5b58 = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * 0x60;
        uStack_5b54 = (uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * 0x60;
        uStack_5b50 = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * 0x60;
        uStack_5b4c = (uint)bVar10 * auVar41._20_4_ | (uint)!bVar10 * 0x60;
        uStack_5b48 = (uint)bVar11 * auVar41._24_4_ | (uint)!bVar11 * 0x60;
        uStack_5b44 = (uint)bVar12 * auVar41._28_4_ | (uint)!bVar12 * 0x60;
        uVar39 = vcmpps_avx512vl(_local_5ba0,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar28 = (bool)((byte)uVar39 & 1);
        bVar6 = (bool)((byte)(uVar39 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar39 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar39 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar39 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar39 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar39 >> 6) & 1);
        bVar12 = SUB81(uVar39 >> 7,0);
        local_5b40 = (uint)bVar28 * auVar41._0_4_ | (uint)!bVar28 * 0xa0;
        uStack_5b3c = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * 0xa0;
        uStack_5b38 = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * 0xa0;
        uStack_5b34 = (uint)bVar8 * auVar41._12_4_ | (uint)!bVar8 * 0xa0;
        uStack_5b30 = (uint)bVar9 * auVar41._16_4_ | (uint)!bVar9 * 0xa0;
        uStack_5b2c = (uint)bVar10 * auVar41._20_4_ | (uint)!bVar10 * 0xa0;
        uStack_5b28 = (uint)bVar11 * auVar41._24_4_ | (uint)!bVar11 * 0xa0;
        uStack_5b24 = (uint)bVar12 * auVar41._28_4_ | (uint)!bVar12 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar83 = ZEXT3264(local_4680);
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar42);
        local_5b20._0_4_ =
             (uint)(bVar27 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar27 & 1) * local_4680._0_4_;
        bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
        local_5b20._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * local_4680._4_4_;
        bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
        local_5b20._8_4_ = (uint)bVar28 * auVar41._8_4_ | (uint)!bVar28 * local_4680._8_4_;
        bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
        local_5b20._12_4_ = (uint)bVar28 * auVar41._12_4_ | (uint)!bVar28 * local_4680._12_4_;
        bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
        local_5b20._16_4_ = (uint)bVar28 * auVar41._16_4_ | (uint)!bVar28 * local_4680._16_4_;
        bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
        local_5b20._20_4_ = (uint)bVar28 * auVar41._20_4_ | (uint)!bVar28 * local_4680._20_4_;
        bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
        local_5b20._24_4_ = (uint)bVar28 * auVar41._24_4_ | (uint)!bVar28 * local_4680._24_4_;
        bVar28 = SUB81(uVar40 >> 7,0);
        local_5b20._28_4_ = (uint)bVar28 * auVar41._28_4_ | (uint)!bVar28 * local_4680._28_4_;
        local_5d9c = (undefined4)uVar40;
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar42);
        local_5b00._0_4_ =
             (uint)(bVar27 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar27 & 1) * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
        local_5b00._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
        local_5b00._8_4_ = (uint)bVar28 * auVar41._8_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
        local_5b00._12_4_ = (uint)bVar28 * auVar41._12_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
        local_5b00._16_4_ = (uint)bVar28 * auVar41._16_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
        local_5b00._20_4_ = (uint)bVar28 * auVar41._20_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
        local_5b00._24_4_ = (uint)bVar28 * auVar41._24_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = SUB81(uVar40 >> 7,0);
        local_5b00._28_4_ = (uint)bVar28 * auVar41._28_4_ | (uint)!bVar28 * -0x800000;
        local_5dcc = (uint)(byte)~bVar27;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar40 = 7;
        }
        else {
          uVar40 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5d90 = ray + 0x100;
        puVar36 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar33 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5b20;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar84 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar85 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar86 = ZEXT3264(auVar41);
        local_5db8 = uVar40;
        local_5db0 = ray;
        local_5da8 = context;
        local_5d48 = This;
LAB_01dd5077:
        do {
          do {
            root.ptr = puVar36[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd5cb7;
            puVar36 = puVar36 + -1;
            pauVar33 = pauVar33 + -1;
            auVar41 = *pauVar33;
            auVar80 = ZEXT3264(auVar41);
            uVar39 = vcmpps_avx512vl(auVar41,local_5b00,1);
          } while ((char)uVar39 == '\0');
          uVar38 = (undefined4)uVar39;
          if (uVar40 < (uint)POPCOUNT(uVar38)) {
LAB_01dd50b7:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd5cb7;
                uVar20 = vcmpps_avx512vl(auVar80._0_32_,local_5b00,9);
                if ((char)uVar20 == '\0') goto LAB_01dd5077;
                local_5d40 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar30 = (uint)(byte)~(byte)local_5dcc;
                lVar31 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                lVar32 = 0;
                goto LAB_01dd529e;
              }
              uVar39 = 8;
              auVar41 = auVar83._0_32_;
              for (lVar31 = 0;
                  (auVar80 = ZEXT3264(auVar41), lVar31 != 8 &&
                  (uVar35 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar31 * 8), uVar35 != 8));
                  lVar31 = lVar31 + 1) {
                uVar38 = *(undefined4 *)(root.ptr + 0x40 + lVar31 * 4);
                auVar68._4_4_ = uVar38;
                auVar68._0_4_ = uVar38;
                auVar68._8_4_ = uVar38;
                auVar68._12_4_ = uVar38;
                auVar68._16_4_ = uVar38;
                auVar68._20_4_ = uVar38;
                auVar68._24_4_ = uVar38;
                auVar68._28_4_ = uVar38;
                auVar65._8_8_ = local_5ca0._8_8_;
                auVar65._0_8_ = local_5ca0._0_8_;
                auVar65._16_8_ = local_5ca0._16_8_;
                auVar65._24_8_ = local_5ca0._24_8_;
                auVar24._8_8_ = local_5ca0._40_8_;
                auVar24._0_8_ = local_5ca0._32_8_;
                auVar24._16_8_ = local_5ca0._48_8_;
                auVar24._24_8_ = local_5ca0._56_8_;
                auVar25._8_8_ = local_5ca0._72_8_;
                auVar25._0_8_ = local_5ca0._64_8_;
                auVar25._16_8_ = local_5ca0._80_8_;
                auVar25._24_8_ = local_5ca0._88_8_;
                auVar42 = vsubps_avx(auVar68,auVar65);
                auVar80._0_4_ = (float)local_5be0._0_4_ * auVar42._0_4_;
                auVar80._4_4_ = (float)local_5be0._4_4_ * auVar42._4_4_;
                auVar80._8_4_ = fStack_5bd8 * auVar42._8_4_;
                auVar80._12_4_ = fStack_5bd4 * auVar42._12_4_;
                auVar80._16_4_ = fStack_5bd0 * auVar42._16_4_;
                auVar80._20_4_ = fStack_5bcc * auVar42._20_4_;
                auVar80._28_36_ = auVar77._28_36_;
                auVar80._24_4_ = fStack_5bc8 * auVar42._24_4_;
                auVar67 = auVar80._0_32_;
                auVar77 = ZEXT3264(auVar67);
                uVar38 = *(undefined4 *)(root.ptr + 0x80 + lVar31 * 4);
                auVar69._4_4_ = uVar38;
                auVar69._0_4_ = uVar38;
                auVar69._8_4_ = uVar38;
                auVar69._12_4_ = uVar38;
                auVar69._16_4_ = uVar38;
                auVar69._20_4_ = uVar38;
                auVar69._24_4_ = uVar38;
                auVar69._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar69,auVar24);
                auVar78._0_4_ = (float)local_5bc0._0_4_ * auVar42._0_4_;
                auVar78._4_4_ = (float)local_5bc0._4_4_ * auVar42._4_4_;
                auVar78._8_4_ = fStack_5bb8 * auVar42._8_4_;
                auVar78._12_4_ = fStack_5bb4 * auVar42._12_4_;
                auVar78._16_4_ = fStack_5bb0 * auVar42._16_4_;
                auVar78._20_4_ = fStack_5bac * auVar42._20_4_;
                auVar78._28_36_ = in_ZMM7._28_36_;
                auVar78._24_4_ = fStack_5ba8 * auVar42._24_4_;
                auVar75 = auVar78._0_32_;
                in_ZMM7 = ZEXT3264(auVar75);
                uVar38 = *(undefined4 *)(root.ptr + 0xc0 + lVar31 * 4);
                auVar70._4_4_ = uVar38;
                auVar70._0_4_ = uVar38;
                auVar70._8_4_ = uVar38;
                auVar70._12_4_ = uVar38;
                auVar70._16_4_ = uVar38;
                auVar70._20_4_ = uVar38;
                auVar70._24_4_ = uVar38;
                auVar70._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar70,auVar25);
                auVar79._0_4_ = (float)local_5ba0._0_4_ * auVar42._0_4_;
                auVar79._4_4_ = (float)local_5ba0._4_4_ * auVar42._4_4_;
                auVar79._8_4_ = fStack_5b98 * auVar42._8_4_;
                auVar79._12_4_ = fStack_5b94 * auVar42._12_4_;
                auVar79._16_4_ = fStack_5b90 * auVar42._16_4_;
                auVar79._20_4_ = fStack_5b8c * auVar42._20_4_;
                auVar79._28_36_ = in_ZMM9._28_36_;
                auVar79._24_4_ = fStack_5b88 * auVar42._24_4_;
                auVar74 = auVar79._0_32_;
                in_ZMM9 = ZEXT3264(auVar74);
                uVar38 = *(undefined4 *)(root.ptr + 0x60 + lVar31 * 4);
                auVar71._4_4_ = uVar38;
                auVar71._0_4_ = uVar38;
                auVar71._8_4_ = uVar38;
                auVar71._12_4_ = uVar38;
                auVar71._16_4_ = uVar38;
                auVar71._20_4_ = uVar38;
                auVar71._24_4_ = uVar38;
                auVar71._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar71,auVar65);
                auVar61._4_4_ = (float)local_5be0._4_4_ * auVar42._4_4_;
                auVar61._0_4_ = (float)local_5be0._0_4_ * auVar42._0_4_;
                auVar61._8_4_ = fStack_5bd8 * auVar42._8_4_;
                auVar61._12_4_ = fStack_5bd4 * auVar42._12_4_;
                auVar61._16_4_ = fStack_5bd0 * auVar42._16_4_;
                auVar61._20_4_ = fStack_5bcc * auVar42._20_4_;
                auVar61._24_4_ = fStack_5bc8 * auVar42._24_4_;
                auVar61._28_4_ = (int)((ulong)local_5ca0._24_8_ >> 0x20);
                uVar38 = *(undefined4 *)(root.ptr + 0xa0 + lVar31 * 4);
                auVar72._4_4_ = uVar38;
                auVar72._0_4_ = uVar38;
                auVar72._8_4_ = uVar38;
                auVar72._12_4_ = uVar38;
                auVar72._16_4_ = uVar38;
                auVar72._20_4_ = uVar38;
                auVar72._24_4_ = uVar38;
                auVar72._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar72,auVar24);
                auVar63._4_4_ = (float)local_5bc0._4_4_ * auVar42._4_4_;
                auVar63._0_4_ = (float)local_5bc0._0_4_ * auVar42._0_4_;
                auVar63._8_4_ = fStack_5bb8 * auVar42._8_4_;
                auVar63._12_4_ = fStack_5bb4 * auVar42._12_4_;
                auVar63._16_4_ = fStack_5bb0 * auVar42._16_4_;
                auVar63._20_4_ = fStack_5bac * auVar42._20_4_;
                auVar63._24_4_ = fStack_5ba8 * auVar42._24_4_;
                auVar63._28_4_ = (int)((ulong)local_5ca0._56_8_ >> 0x20);
                uVar38 = *(undefined4 *)(root.ptr + 0xe0 + lVar31 * 4);
                auVar73._4_4_ = uVar38;
                auVar73._0_4_ = uVar38;
                auVar73._8_4_ = uVar38;
                auVar73._12_4_ = uVar38;
                auVar73._16_4_ = uVar38;
                auVar73._20_4_ = uVar38;
                auVar73._24_4_ = uVar38;
                auVar73._28_4_ = uVar38;
                auVar42 = vsubps_avx(auVar73,auVar25);
                auVar64._4_4_ = (float)local_5ba0._4_4_ * auVar42._4_4_;
                auVar64._0_4_ = (float)local_5ba0._0_4_ * auVar42._0_4_;
                auVar64._8_4_ = fStack_5b98 * auVar42._8_4_;
                auVar64._12_4_ = fStack_5b94 * auVar42._12_4_;
                auVar64._16_4_ = fStack_5b90 * auVar42._16_4_;
                auVar64._20_4_ = fStack_5b8c * auVar42._20_4_;
                auVar64._24_4_ = fStack_5b88 * auVar42._24_4_;
                auVar64._28_4_ = (int)((ulong)local_5ca0._88_8_ >> 0x20);
                auVar42 = vminps_avx(auVar67,auVar61);
                auVar43 = vminps_avx(auVar75,auVar63);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar43 = vminps_avx(auVar74,auVar64);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar44 = vmulps_avx512vl(auVar42,auVar84._0_32_);
                auVar42 = vmaxps_avx(auVar67,auVar61);
                auVar43 = vmaxps_avx(auVar75,auVar63);
                auVar43 = vminps_avx(auVar42,auVar43);
                auVar42 = vmaxps_avx(auVar74,auVar64);
                auVar42 = vminps_avx(auVar43,auVar42);
                auVar43 = vmulps_avx512vl(auVar42,auVar85._0_32_);
                auVar42 = vmaxps_avx(auVar44,local_5b20);
                auVar43 = vminps_avx(auVar43,local_5b00);
                uVar19 = vcmpps_avx512vl(auVar42,auVar43,2);
                uVar34 = uVar39;
                auVar45 = auVar41;
                if ((byte)uVar19 != 0) {
                  auVar42 = vblendmps_avx512vl(auVar83._0_32_,auVar44);
                  bVar28 = (bool)((byte)uVar19 & 1);
                  auVar45._0_4_ = (uint)bVar28 * auVar42._0_4_ | (uint)!bVar28 * auVar44._0_4_;
                  bVar28 = (bool)((byte)(uVar19 >> 1) & 1);
                  auVar45._4_4_ = (uint)bVar28 * auVar42._4_4_ | (uint)!bVar28 * auVar44._4_4_;
                  bVar28 = (bool)((byte)(uVar19 >> 2) & 1);
                  auVar45._8_4_ = (uint)bVar28 * auVar42._8_4_ | (uint)!bVar28 * auVar44._8_4_;
                  bVar28 = (bool)((byte)(uVar19 >> 3) & 1);
                  auVar45._12_4_ = (uint)bVar28 * auVar42._12_4_ | (uint)!bVar28 * auVar44._12_4_;
                  bVar28 = (bool)((byte)(uVar19 >> 4) & 1);
                  auVar45._16_4_ = (uint)bVar28 * auVar42._16_4_ | (uint)!bVar28 * auVar44._16_4_;
                  bVar28 = (bool)((byte)(uVar19 >> 5) & 1);
                  auVar45._20_4_ = (uint)bVar28 * auVar42._20_4_ | (uint)!bVar28 * auVar44._20_4_;
                  bVar28 = (bool)((byte)(uVar19 >> 6) & 1);
                  auVar45._24_4_ = (uint)bVar28 * auVar42._24_4_ | (uint)!bVar28 * auVar44._24_4_;
                  bVar28 = SUB81(uVar19 >> 7,0);
                  auVar45._28_4_ = (uint)bVar28 * auVar42._28_4_ | (uint)!bVar28 * auVar44._28_4_;
                  uVar34 = uVar35;
                  if (uVar39 != 8) {
                    *puVar36 = uVar39;
                    puVar36 = puVar36 + 1;
                    *pauVar33 = auVar41;
                    pauVar33 = pauVar33 + 1;
                  }
                }
                auVar41 = auVar45;
                uVar39 = uVar34;
              }
              if (uVar39 == 8) goto LAB_01dd5241;
              uVar20 = vcmpps_avx512vl(auVar41,local_5b00,9);
              root.ptr = uVar39;
            } while ((byte)uVar40 < (byte)POPCOUNT((int)uVar20));
            *puVar36 = uVar39;
            puVar36 = puVar36 + 1;
            *pauVar33 = auVar41;
            pauVar33 = pauVar33 + 1;
LAB_01dd5241:
            iVar29 = 4;
          }
          else {
            while (local_5d00 = auVar41, bVar27 = (byte)local_5dcc, uVar39 != 0) {
              k = 0;
              for (uVar40 = uVar39; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              uVar39 = uVar39 - 1 & uVar39;
              auVar77 = ZEXT1664(auVar77._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar28 = occluded1(local_5d48,local_5d50,root,k,&local_5db9,local_5db0,
                                 (TravRayK<8,_true> *)&local_5ca0.field_0,context);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar86 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar83 = ZEXT3264(auVar41);
              bVar26 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar28) {
                bVar26 = 0;
              }
              local_5dcc = (uint)(bVar27 | bVar26);
              ray = local_5db0;
              uVar40 = local_5db8;
              context = local_5da8;
              auVar41 = local_5d00;
            }
            iVar29 = 3;
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar84 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar85 = ZEXT3264(auVar41);
            auVar80 = ZEXT3264(local_5d00);
            if (bVar27 != 0xff) {
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5b00._0_4_ =
                   (uint)(bVar27 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar27 & 1) * local_5b00._0_4_
              ;
              bVar28 = (bool)((byte)(local_5dcc >> 1) & 1);
              local_5b00._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * local_5b00._4_4_;
              bVar28 = (bool)((byte)(local_5dcc >> 2) & 1);
              local_5b00._8_4_ = (uint)bVar28 * auVar41._8_4_ | (uint)!bVar28 * local_5b00._8_4_;
              bVar28 = (bool)((byte)(local_5dcc >> 3) & 1);
              local_5b00._12_4_ = (uint)bVar28 * auVar41._12_4_ | (uint)!bVar28 * local_5b00._12_4_;
              bVar28 = (bool)((byte)(local_5dcc >> 4) & 1);
              local_5b00._16_4_ = (uint)bVar28 * auVar41._16_4_ | (uint)!bVar28 * local_5b00._16_4_;
              bVar28 = (bool)((byte)(local_5dcc >> 5) & 1);
              local_5b00._20_4_ = (uint)bVar28 * auVar41._20_4_ | (uint)!bVar28 * local_5b00._20_4_;
              bVar28 = (bool)((byte)(local_5dcc >> 6) & 1);
              local_5b00._24_4_ = (uint)bVar28 * auVar41._24_4_ | (uint)!bVar28 * local_5b00._24_4_;
              local_5b00._28_4_ =
                   (local_5dcc >> 7) * auVar41._28_4_ |
                   (uint)!SUB41(local_5dcc >> 7,0) * local_5b00._28_4_;
              iVar29 = 2;
            }
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar81 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar82 = ZEXT3264(auVar41);
            if ((uint)uVar40 < (uint)POPCOUNT(uVar38)) goto LAB_01dd50b7;
          }
        } while ((iVar29 == 4) || (iVar29 == 2));
LAB_01dd5cb7:
        local_5d9c._0_1_ = (byte)local_5dcc & (byte)local_5d9c;
        bVar28 = (bool)((byte)local_5d9c >> 1 & 1);
        bVar6 = (bool)((byte)local_5d9c >> 2 & 1);
        bVar7 = (bool)((byte)local_5d9c >> 3 & 1);
        bVar8 = (bool)((byte)local_5d9c >> 4 & 1);
        bVar9 = (bool)((byte)local_5d9c >> 5 & 1);
        bVar10 = (bool)((byte)local_5d9c >> 6 & 1);
        *(uint *)local_5d90 =
             (uint)((byte)local_5d9c & 1) * -0x800000 |
             (uint)!(bool)((byte)local_5d9c & 1) * *(int *)local_5d90;
        *(uint *)(local_5d90 + 4) =
             (uint)bVar28 * -0x800000 | (uint)!bVar28 * *(int *)(local_5d90 + 4);
        *(uint *)(local_5d90 + 8) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_5d90 + 8);
        *(uint *)(local_5d90 + 0xc) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_5d90 + 0xc);
        *(uint *)(local_5d90 + 0x10) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5d90 + 0x10);
        *(uint *)(local_5d90 + 0x14) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5d90 + 0x14);
        *(uint *)(local_5d90 + 0x18) =
             (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_5d90 + 0x18);
        *(uint *)(local_5d90 + 0x1c) =
             (uint)((byte)local_5d9c >> 7) * -0x800000 |
             (uint)!(bool)((byte)local_5d9c >> 7) * *(int *)(local_5d90 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01dd529e:
  do {
    if (lVar32 == local_5d40) goto LAB_01dd5b67;
    local_5d28 = lVar32 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_5d30 = context->scene;
    lVar37 = 0;
    local_5d00._0_8_ = lVar31;
    local_5d98 = uVar30;
    local_5d38 = lVar32;
    do {
      bVar27 = (byte)uVar30;
      if ((lVar37 == 4) || (*(int *)(lVar31 + lVar37 * 4) == -1)) goto LAB_01dd5b49;
      pfVar3 = (local_5d30->vertices).items[*(uint *)(lVar31 + -0x10 + lVar37 * 4)];
      uVar39 = (ulong)*(uint *)(lVar31 + -0x40 + lVar37 * 4);
      uVar35 = (ulong)*(uint *)(lVar31 + -0x30 + lVar37 * 4);
      fVar1 = pfVar3[uVar39];
      auVar74._4_4_ = fVar1;
      auVar74._0_4_ = fVar1;
      auVar74._8_4_ = fVar1;
      auVar74._12_4_ = fVar1;
      auVar74._16_4_ = fVar1;
      auVar74._20_4_ = fVar1;
      auVar74._24_4_ = fVar1;
      auVar74._28_4_ = fVar1;
      fVar1 = pfVar3[uVar39 + 1];
      auVar46._4_4_ = fVar1;
      auVar46._0_4_ = fVar1;
      auVar46._8_4_ = fVar1;
      auVar46._12_4_ = fVar1;
      auVar46._16_4_ = fVar1;
      auVar46._20_4_ = fVar1;
      auVar46._24_4_ = fVar1;
      auVar46._28_4_ = fVar1;
      fVar1 = pfVar3[uVar39 + 2];
      auVar47._4_4_ = fVar1;
      auVar47._0_4_ = fVar1;
      auVar47._8_4_ = fVar1;
      auVar47._12_4_ = fVar1;
      auVar47._16_4_ = fVar1;
      auVar47._20_4_ = fVar1;
      auVar47._24_4_ = fVar1;
      auVar47._28_4_ = fVar1;
      fVar1 = pfVar3[uVar35];
      auVar48._4_4_ = fVar1;
      auVar48._0_4_ = fVar1;
      auVar48._8_4_ = fVar1;
      auVar48._12_4_ = fVar1;
      auVar48._16_4_ = fVar1;
      auVar48._20_4_ = fVar1;
      auVar48._24_4_ = fVar1;
      auVar48._28_4_ = fVar1;
      fVar1 = pfVar3[uVar35 + 1];
      auVar49._4_4_ = fVar1;
      auVar49._0_4_ = fVar1;
      auVar49._8_4_ = fVar1;
      auVar49._12_4_ = fVar1;
      auVar49._16_4_ = fVar1;
      auVar49._20_4_ = fVar1;
      auVar49._24_4_ = fVar1;
      auVar49._28_4_ = fVar1;
      fVar1 = pfVar3[uVar35 + 2];
      auVar50._4_4_ = fVar1;
      auVar50._0_4_ = fVar1;
      auVar50._8_4_ = fVar1;
      auVar50._12_4_ = fVar1;
      auVar50._16_4_ = fVar1;
      auVar50._20_4_ = fVar1;
      auVar50._24_4_ = fVar1;
      auVar50._28_4_ = fVar1;
      uVar39 = (ulong)*(uint *)(lVar31 + -0x20 + lVar37 * 4);
      fVar1 = pfVar3[uVar39];
      auVar51._4_4_ = fVar1;
      auVar51._0_4_ = fVar1;
      auVar51._8_4_ = fVar1;
      auVar51._12_4_ = fVar1;
      auVar51._16_4_ = fVar1;
      auVar51._20_4_ = fVar1;
      auVar51._24_4_ = fVar1;
      auVar51._28_4_ = fVar1;
      fVar1 = pfVar3[uVar39 + 1];
      auVar52._4_4_ = fVar1;
      auVar52._0_4_ = fVar1;
      auVar52._8_4_ = fVar1;
      auVar52._12_4_ = fVar1;
      auVar52._16_4_ = fVar1;
      auVar52._20_4_ = fVar1;
      auVar52._24_4_ = fVar1;
      auVar52._28_4_ = fVar1;
      fVar1 = pfVar3[uVar39 + 2];
      auVar53._4_4_ = fVar1;
      auVar53._0_4_ = fVar1;
      auVar53._8_4_ = fVar1;
      auVar53._12_4_ = fVar1;
      auVar53._16_4_ = fVar1;
      auVar53._20_4_ = fVar1;
      auVar53._24_4_ = fVar1;
      auVar53._28_4_ = fVar1;
      local_5cb0 = *(undefined8 *)(local_5d28 + 0x30);
      uStack_5ca8 = *(undefined8 *)(local_5d28 + 0x38);
      local_5cc0 = *(undefined8 *)(local_5d28 + 0x40);
      uStack_5cb8 = *(undefined8 *)(local_5d28 + 0x48);
      auVar41 = *(undefined1 (*) [32])ray;
      auVar42 = *(undefined1 (*) [32])(ray + 0x20);
      auVar43 = *(undefined1 (*) [32])(ray + 0x40);
      auVar44 = *(undefined1 (*) [32])(ray + 0x80);
      auVar77 = ZEXT3264(auVar44);
      auVar67 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar75 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar74 = vsubps_avx(auVar74,auVar41);
      auVar46 = vsubps_avx512vl(auVar46,auVar42);
      auVar47 = vsubps_avx512vl(auVar47,auVar43);
      in_ZMM7 = ZEXT3264(auVar47);
      auVar48 = vsubps_avx512vl(auVar48,auVar41);
      auVar49 = vsubps_avx512vl(auVar49,auVar42);
      auVar50 = vsubps_avx512vl(auVar50,auVar43);
      auVar51 = vsubps_avx512vl(auVar51,auVar41);
      auVar52 = vsubps_avx512vl(auVar52,auVar42);
      auVar43 = vsubps_avx512vl(auVar53,auVar43);
      auVar53 = vsubps_avx512vl(auVar51,auVar74);
      auVar54 = vsubps_avx512vl(auVar52,auVar46);
      auVar55 = vsubps_avx512vl(auVar43,auVar47);
      auVar56 = vsubps_avx512vl(auVar74,auVar48);
      auVar57 = vsubps_avx512vl(auVar46,auVar49);
      auVar58 = vsubps_avx512vl(auVar47,auVar50);
      auVar59 = vsubps_avx512vl(auVar48,auVar51);
      auVar60 = vsubps_avx512vl(auVar49,auVar52);
      auVar61 = vsubps_avx512vl(auVar50,auVar43);
      auVar42 = vaddps_avx512vl(auVar51,auVar74);
      auVar62 = vaddps_avx512vl(auVar52,auVar46);
      auVar41 = vaddps_avx512vl(auVar43,auVar47);
      auVar63 = vmulps_avx512vl(auVar62,auVar55);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar54,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar53);
      auVar64 = vfmsub231ps_avx512vl(auVar41,auVar55,auVar42);
      auVar41._4_4_ = auVar42._4_4_ * auVar54._4_4_;
      auVar41._0_4_ = auVar42._0_4_ * auVar54._0_4_;
      auVar41._8_4_ = auVar42._8_4_ * auVar54._8_4_;
      auVar41._12_4_ = auVar42._12_4_ * auVar54._12_4_;
      auVar41._16_4_ = auVar42._16_4_ * auVar54._16_4_;
      auVar41._20_4_ = auVar42._20_4_ * auVar54._20_4_;
      auVar41._24_4_ = auVar42._24_4_ * auVar54._24_4_;
      auVar41._28_4_ = auVar42._28_4_;
      auVar76 = vfmsub231ps_fma(auVar41,auVar53,auVar62);
      fVar1 = auVar75._0_4_;
      auVar62._0_4_ = auVar76._0_4_ * fVar1;
      fVar13 = auVar75._4_4_;
      auVar62._4_4_ = auVar76._4_4_ * fVar13;
      fVar14 = auVar75._8_4_;
      auVar62._8_4_ = auVar76._8_4_ * fVar14;
      fVar15 = auVar75._12_4_;
      auVar62._12_4_ = auVar76._12_4_ * fVar15;
      fVar16 = auVar75._16_4_;
      auVar62._16_4_ = fVar16 * 0.0;
      fVar17 = auVar75._20_4_;
      auVar62._20_4_ = fVar17 * 0.0;
      fVar18 = auVar75._24_4_;
      auVar62._24_4_ = fVar18 * 0.0;
      auVar62._28_4_ = 0;
      auVar41 = vfmadd231ps_avx512vl(auVar62,auVar67,auVar64);
      auVar62 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar63);
      in_ZMM9 = ZEXT3264(auVar62);
      auVar41 = vaddps_avx512vl(auVar74,auVar48);
      auVar42 = vaddps_avx512vl(auVar46,auVar49);
      auVar63 = vaddps_avx512vl(auVar47,auVar50);
      auVar64 = vmulps_avx512vl(auVar42,auVar58);
      auVar64 = vfmsub231ps_avx512vl(auVar64,auVar57,auVar63);
      auVar63 = vmulps_avx512vl(auVar63,auVar56);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar58,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar57);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar56,auVar42);
      auVar42._4_4_ = auVar41._4_4_ * fVar13;
      auVar42._0_4_ = auVar41._0_4_ * fVar1;
      auVar42._8_4_ = auVar41._8_4_ * fVar14;
      auVar42._12_4_ = auVar41._12_4_ * fVar15;
      auVar42._16_4_ = auVar41._16_4_ * fVar16;
      auVar42._20_4_ = auVar41._20_4_ * fVar17;
      auVar42._24_4_ = auVar41._24_4_ * fVar18;
      auVar42._28_4_ = auVar41._28_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar42,auVar67,auVar63);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar63 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar64);
      auVar41 = vaddps_avx512vl(auVar48,auVar51);
      auVar48 = vaddps_avx512vl(auVar49,auVar52);
      auVar43 = vaddps_avx512vl(auVar50,auVar43);
      auVar49 = vmulps_avx512vl(auVar48,auVar61);
      auVar49 = vfmsub231ps_avx512vl(auVar49,auVar60,auVar43);
      auVar43 = vmulps_avx512vl(auVar43,auVar59);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar61,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar60);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar59,auVar48);
      auVar41 = vmulps_avx512vl(auVar41,auVar75);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar67,auVar43);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar49);
      auVar43 = vaddps_avx512vl(auVar62,auVar63);
      auVar50 = vaddps_avx512vl(auVar41,auVar43);
      auVar51 = auVar81._0_32_;
      vandps_avx512vl(auVar50,auVar51);
      auVar43 = vmulps_avx512vl(auVar50,auVar86._0_32_);
      auVar48 = vminps_avx512vl(auVar62,auVar63);
      auVar48 = vminps_avx512vl(auVar48,auVar41);
      auVar49 = vxorps_avx512vl(auVar43,auVar42);
      uVar20 = vcmpps_avx512vl(auVar48,auVar49,5);
      auVar48 = vmaxps_avx512vl(auVar62,auVar63);
      auVar41 = vmaxps_avx512vl(auVar48,auVar41);
      uVar21 = vcmpps_avx512vl(auVar41,auVar43,2);
      bVar26 = ((byte)uVar20 | (byte)uVar21) & bVar27;
      auVar43 = auVar82._0_32_;
      if (bVar26 == 0) {
LAB_01dd56f3:
        auVar50 = auVar41;
        bVar26 = 0;
      }
      else {
        auVar41 = vmulps_avx512vl(auVar57,auVar55);
        auVar48 = vmulps_avx512vl(auVar53,auVar58);
        auVar49 = vmulps_avx512vl(auVar56,auVar54);
        auVar52 = vmulps_avx512vl(auVar60,auVar58);
        auVar64 = vmulps_avx512vl(auVar56,auVar61);
        auVar65 = vmulps_avx512vl(auVar59,auVar57);
        auVar54 = vfmsub213ps_avx512vl(auVar54,auVar58,auVar41);
        auVar55 = vfmsub213ps_avx512vl(auVar55,auVar56,auVar48);
        auVar53 = vfmsub213ps_avx512vl(auVar53,auVar57,auVar49);
        auVar57 = vfmsub213ps_avx512vl(auVar61,auVar57,auVar52);
        auVar58 = vfmsub213ps_avx512vl(auVar59,auVar58,auVar64);
        auVar56 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar65);
        vandps_avx512vl(auVar41,auVar51);
        vandps_avx512vl(auVar52,auVar51);
        uVar39 = vcmpps_avx512vl(auVar56,auVar56,1);
        vandps_avx512vl(auVar48,auVar51);
        vandps_avx512vl(auVar64,auVar51);
        uVar35 = vcmpps_avx512vl(auVar56,auVar56,1);
        vandps_avx512vl(auVar49,auVar51);
        vandps_avx512vl(auVar65,auVar51);
        uVar19 = vcmpps_avx512vl(auVar56,auVar56,1);
        bVar28 = (bool)((byte)uVar39 & 1);
        auVar59._0_4_ = (uint)bVar28 * auVar54._0_4_ | (uint)!bVar28 * auVar57._0_4_;
        bVar28 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar28 * auVar54._4_4_ | (uint)!bVar28 * auVar57._4_4_;
        bVar28 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar28 * auVar54._8_4_ | (uint)!bVar28 * auVar57._8_4_;
        bVar28 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar28 * auVar54._12_4_ | (uint)!bVar28 * auVar57._12_4_;
        bVar28 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar59._16_4_ = (uint)bVar28 * auVar54._16_4_ | (uint)!bVar28 * auVar57._16_4_;
        bVar28 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar59._20_4_ = (uint)bVar28 * auVar54._20_4_ | (uint)!bVar28 * auVar57._20_4_;
        bVar28 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar59._24_4_ = (uint)bVar28 * auVar54._24_4_ | (uint)!bVar28 * auVar57._24_4_;
        bVar28 = SUB81(uVar39 >> 7,0);
        auVar59._28_4_ = (uint)bVar28 * auVar54._28_4_ | (uint)!bVar28 * auVar57._28_4_;
        bVar28 = (bool)((byte)uVar35 & 1);
        aVar66._0_4_ = (uint)bVar28 * auVar55._0_4_ | (uint)!bVar28 * auVar58._0_4_;
        bVar28 = (bool)((byte)(uVar35 >> 1) & 1);
        aVar66._4_4_ = (uint)bVar28 * auVar55._4_4_ | (uint)!bVar28 * auVar58._4_4_;
        bVar28 = (bool)((byte)(uVar35 >> 2) & 1);
        aVar66._8_4_ = (uint)bVar28 * auVar55._8_4_ | (uint)!bVar28 * auVar58._8_4_;
        bVar28 = (bool)((byte)(uVar35 >> 3) & 1);
        aVar66._12_4_ = (uint)bVar28 * auVar55._12_4_ | (uint)!bVar28 * auVar58._12_4_;
        bVar28 = (bool)((byte)(uVar35 >> 4) & 1);
        aVar66._16_4_ = (uint)bVar28 * auVar55._16_4_ | (uint)!bVar28 * auVar58._16_4_;
        bVar28 = (bool)((byte)(uVar35 >> 5) & 1);
        aVar66._20_4_ = (uint)bVar28 * auVar55._20_4_ | (uint)!bVar28 * auVar58._20_4_;
        bVar28 = (bool)((byte)(uVar35 >> 6) & 1);
        aVar66._24_4_ = (uint)bVar28 * auVar55._24_4_ | (uint)!bVar28 * auVar58._24_4_;
        bVar28 = SUB81(uVar35 >> 7,0);
        aVar66._28_4_ = (uint)bVar28 * auVar55._28_4_ | (uint)!bVar28 * auVar58._28_4_;
        bVar28 = (bool)((byte)uVar19 & 1);
        auVar55._0_4_ = (float)((uint)bVar28 * auVar53._0_4_ | (uint)!bVar28 * auVar56._0_4_);
        bVar28 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar55._4_4_ = (float)((uint)bVar28 * auVar53._4_4_ | (uint)!bVar28 * auVar56._4_4_);
        bVar28 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar55._8_4_ = (float)((uint)bVar28 * auVar53._8_4_ | (uint)!bVar28 * auVar56._8_4_);
        bVar28 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar55._12_4_ = (float)((uint)bVar28 * auVar53._12_4_ | (uint)!bVar28 * auVar56._12_4_);
        bVar28 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar55._16_4_ = (float)((uint)bVar28 * auVar53._16_4_ | (uint)!bVar28 * auVar56._16_4_);
        bVar28 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar55._20_4_ = (float)((uint)bVar28 * auVar53._20_4_ | (uint)!bVar28 * auVar56._20_4_);
        bVar28 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar55._24_4_ = (float)((uint)bVar28 * auVar53._24_4_ | (uint)!bVar28 * auVar56._24_4_);
        bVar28 = SUB81(uVar19 >> 7,0);
        auVar55._28_4_ = (uint)bVar28 * auVar53._28_4_ | (uint)!bVar28 * auVar56._28_4_;
        auVar54._4_4_ = fVar13 * auVar55._4_4_;
        auVar54._0_4_ = fVar1 * auVar55._0_4_;
        auVar54._8_4_ = fVar14 * auVar55._8_4_;
        auVar54._12_4_ = fVar15 * auVar55._12_4_;
        auVar54._16_4_ = fVar16 * auVar55._16_4_;
        auVar54._20_4_ = fVar17 * auVar55._20_4_;
        auVar54._24_4_ = fVar18 * auVar55._24_4_;
        auVar54._28_4_ = auVar75._28_4_;
        auVar76 = vfmadd213ps_fma(auVar67,(undefined1  [32])aVar66,auVar54);
        auVar76 = vfmadd213ps_fma(auVar44,auVar59,ZEXT1632(auVar76));
        auVar75 = ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                     CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                              CONCAT44(auVar76._4_4_ + auVar76._4_4_,
                                                       auVar76._0_4_ + auVar76._0_4_))));
        auVar77 = ZEXT3264(auVar75);
        auVar44._0_4_ = auVar47._0_4_ * auVar55._0_4_;
        auVar44._4_4_ = auVar47._4_4_ * auVar55._4_4_;
        auVar44._8_4_ = auVar47._8_4_ * auVar55._8_4_;
        auVar44._12_4_ = auVar47._12_4_ * auVar55._12_4_;
        auVar44._16_4_ = auVar47._16_4_ * auVar55._16_4_;
        auVar44._20_4_ = auVar47._20_4_ * auVar55._20_4_;
        auVar44._24_4_ = auVar47._24_4_ * auVar55._24_4_;
        auVar44._28_4_ = 0;
        auVar76 = vfmadd213ps_fma(auVar46,(undefined1  [32])aVar66,auVar44);
        auVar23 = vfmadd213ps_fma(auVar74,auVar59,ZEXT1632(auVar76));
        auVar44 = vrcp14ps_avx512vl(auVar75);
        auVar67 = vxorps_avx512vl(auVar75,auVar42);
        auVar41 = vfnmadd213ps_avx512vl(auVar44,auVar75,auVar43);
        auVar76 = vfmadd132ps_fma(auVar41,auVar44,auVar44);
        in_ZMM7 = ZEXT1664(auVar76);
        auVar42 = ZEXT1632(CONCAT412((auVar23._12_4_ + auVar23._12_4_) * auVar76._12_4_,
                                     CONCAT48((auVar23._8_4_ + auVar23._8_4_) * auVar76._8_4_,
                                              CONCAT44((auVar23._4_4_ + auVar23._4_4_) *
                                                       auVar76._4_4_,
                                                       (auVar23._0_4_ + auVar23._0_4_) *
                                                       auVar76._0_4_))));
        uVar20 = vcmpps_avx512vl(auVar42,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar21 = vcmpps_avx512vl(auVar42,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar22 = vcmpps_avx512vl(auVar75,auVar67,4);
        bVar26 = bVar26 & (byte)uVar20 & (byte)uVar21 & (byte)uVar22;
        if (bVar26 == 0) goto LAB_01dd56f3;
        _local_5a20 = auVar62;
        _local_5a40 = auVar63;
        local_5a60 = auVar50;
        local_5a80 = auVar42;
        local_5aa0 = auVar59;
        local_5ac0 = aVar66;
        local_5ae0 = auVar55;
      }
      uVar39 = CONCAT44(0,*(uint *)((long)&local_5cb0 + lVar37 * 4));
      local_5d20._0_8_ = uVar39;
      pGVar4 = (context->scene->geometries).items[uVar39].ptr;
      uVar2 = pGVar4->mask;
      auVar75._4_4_ = uVar2;
      auVar75._0_4_ = uVar2;
      auVar75._8_4_ = uVar2;
      auVar75._12_4_ = uVar2;
      auVar75._16_4_ = uVar2;
      auVar75._20_4_ = uVar2;
      auVar75._24_4_ = uVar2;
      auVar75._28_4_ = uVar2;
      uVar20 = vptestmd_avx512vl(auVar75,*(undefined1 (*) [32])(ray + 0x120));
      bVar26 = (byte)uVar20 & bVar26;
      if (bVar26 != 0) {
        local_5d94 = *(undefined4 *)((long)&local_5cc0 + lVar37 * 4);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          vandps_avx512vl(local_5a60,auVar51);
          auVar56._8_4_ = 0x219392ef;
          auVar56._0_8_ = 0x219392ef219392ef;
          auVar56._12_4_ = 0x219392ef;
          auVar56._16_4_ = 0x219392ef;
          auVar56._20_4_ = 0x219392ef;
          auVar56._24_4_ = 0x219392ef;
          auVar56._28_4_ = 0x219392ef;
          uVar40 = vcmpps_avx512vl(auVar50,auVar56,5);
          auVar41 = vrcp14ps_avx512vl(local_5a60);
          auVar42 = vfnmadd213ps_avx512vl(auVar41,local_5a60,auVar43);
          auVar42 = vfmadd132ps_avx512vl(auVar42,auVar41,auVar41);
          fVar1 = (float)((uint)((byte)uVar40 & 1) * auVar42._0_4_);
          fVar18 = (float)((uint)((byte)(uVar40 >> 1) & 1) * auVar42._4_4_);
          fVar17 = (float)((uint)((byte)(uVar40 >> 2) & 1) * auVar42._8_4_);
          fVar16 = (float)((uint)((byte)(uVar40 >> 3) & 1) * auVar42._12_4_);
          fVar15 = (float)((uint)((byte)(uVar40 >> 4) & 1) * auVar42._16_4_);
          fVar14 = (float)((uint)((byte)(uVar40 >> 5) & 1) * auVar42._20_4_);
          fVar13 = (float)((uint)((byte)(uVar40 >> 6) & 1) * auVar42._24_4_);
          auVar57._4_4_ = fVar18 * (float)local_5a20._4_4_;
          auVar57._0_4_ = fVar1 * (float)local_5a20._0_4_;
          auVar57._8_4_ = fVar17 * fStack_5a18;
          auVar57._12_4_ = fVar16 * fStack_5a14;
          auVar57._16_4_ = fVar15 * fStack_5a10;
          auVar57._20_4_ = fVar14 * fStack_5a0c;
          auVar57._24_4_ = fVar13 * fStack_5a08;
          auVar57._28_4_ = auVar41._28_4_;
          local_5960 = vminps_avx512vl(auVar57,auVar43);
          auVar58._4_4_ = fVar18 * (float)local_5a40._4_4_;
          auVar58._0_4_ = fVar1 * (float)local_5a40._0_4_;
          auVar58._8_4_ = fVar17 * fStack_5a38;
          auVar58._12_4_ = fVar16 * fStack_5a34;
          auVar58._16_4_ = fVar15 * fStack_5a30;
          auVar58._20_4_ = fVar14 * fStack_5a2c;
          auVar58._24_4_ = fVar13 * fStack_5a28;
          auVar58._28_4_ = (uint)(byte)(uVar40 >> 7) * auVar42._28_4_;
          local_5980 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                       vminps_avx512vl(auVar58,auVar43);
          local_5a00._0_8_ = local_5aa0._0_8_;
          local_5a00._8_8_ = local_5aa0._8_8_;
          local_5a00._16_8_ = local_5aa0._16_8_;
          local_5a00._24_8_ = local_5aa0._24_8_;
          local_5a00.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5ac0;
          local_5a00._64_8_ = local_5ae0._0_8_;
          local_5a00._72_8_ = local_5ae0._8_8_;
          local_5a00._80_8_ = local_5ae0._16_8_;
          local_5a00._88_8_ = local_5ae0._24_8_;
          local_59a0 = local_5a80._0_8_;
          uStack_5998 = local_5a80._8_8_;
          uStack_5990 = local_5a80._16_8_;
          uStack_5988 = local_5a80._24_8_;
          local_5d80.valid = (int *)&local_5880;
          local_5d80.geometryUserPtr = &local_58e0;
          local_5d80.context = (RTCRayQueryContext *)&local_58c0;
          local_5d80.ray = (RTCRayN *)&local_58a0;
          auVar77 = ZEXT1664(auVar77._0_16_);
          in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
          in_ZMM9 = ZEXT1664(auVar62._0_16_);
          local_5d88 = pGVar4;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5d80,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5a00.field_0);
          local_5940 = vpbroadcastd_avx512vl();
          local_5960 = vpbroadcastd_avx512vl();
          local_5a00._0_8_ = local_5880;
          local_5a00._8_8_ = uStack_5878;
          local_5a00._16_8_ = uStack_5870;
          local_5a00._24_8_ = uStack_5868;
          local_5a00.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5860;
          local_5a00._64_8_ = local_5840;
          local_5a00._72_8_ = uStack_5838;
          local_5a00._80_8_ = uStack_5830;
          local_5a00._88_8_ = uStack_5828;
          local_59a0 = local_58a0._0_8_;
          uStack_5998 = local_58a0._8_8_;
          uStack_5990 = local_58a0._16_8_;
          uStack_5988 = local_58a0._24_8_;
          local_5980 = local_58c0;
          vpcmpeqd_avx2(local_5940,local_5940);
          uStack_591c = local_5da8->user->instID[0];
          local_5920 = uStack_591c;
          uStack_5918 = uStack_591c;
          uStack_5914 = uStack_591c;
          uStack_5910 = uStack_591c;
          uStack_590c = uStack_591c;
          uStack_5908 = uStack_591c;
          uStack_5904 = uStack_591c;
          uStack_58fc = local_5da8->user->instPrimID[0];
          local_5900 = uStack_58fc;
          uStack_58f8 = uStack_58fc;
          uStack_58f4 = uStack_58fc;
          uStack_58f0 = uStack_58fc;
          uStack_58ec = uStack_58fc;
          uStack_58e8 = uStack_58fc;
          uStack_58e4 = uStack_58fc;
          local_5d20 = *(undefined1 (*) [32])(local_5db0 + 0x100);
          auVar41 = vblendmps_avx512vl(local_5d20,(undefined1  [32])local_58e0);
          bVar28 = (bool)(bVar26 >> 1 & 1);
          bVar6 = (bool)(bVar26 >> 2 & 1);
          bVar7 = (bool)(bVar26 >> 3 & 1);
          bVar8 = (bool)(bVar26 >> 4 & 1);
          bVar9 = (bool)(bVar26 >> 5 & 1);
          bVar10 = (bool)(bVar26 >> 6 & 1);
          *(uint *)(local_5db0 + 0x100) =
               (uint)(bVar26 & 1) * auVar41._0_4_ | !(bool)(bVar26 & 1) * uStack_58fc;
          *(uint *)(local_5db0 + 0x104) = (uint)bVar28 * auVar41._4_4_ | !bVar28 * uStack_58fc;
          *(uint *)(local_5db0 + 0x108) = (uint)bVar6 * auVar41._8_4_ | !bVar6 * uStack_58fc;
          *(uint *)(local_5db0 + 0x10c) = (uint)bVar7 * auVar41._12_4_ | !bVar7 * uStack_58fc;
          *(uint *)(local_5db0 + 0x110) = (uint)bVar8 * auVar41._16_4_ | !bVar8 * uStack_58fc;
          *(uint *)(local_5db0 + 0x114) = (uint)bVar9 * auVar41._20_4_ | !bVar9 * uStack_58fc;
          *(uint *)(local_5db0 + 0x118) = (uint)bVar10 * auVar41._24_4_ | !bVar10 * uStack_58fc;
          *(uint *)(local_5db0 + 0x11c) =
               (uint)(bVar26 >> 7) * auVar41._28_4_ | !(bool)(bVar26 >> 7) * uStack_58fc;
          local_5ce0 = vpmovm2d_avx512vl((ulong)bVar26);
          local_5d80.valid = (int *)local_5ce0;
          local_5d80.geometryUserPtr = local_5d88->userPtr;
          local_5d80.context = local_5da8->user;
          local_5d80.ray = (RTCRayN *)local_5db0;
          local_5d80.hit = (RTCHitN *)&local_5a00;
          local_5d80.N = 8;
          if (local_5d88->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar77 = ZEXT1664(auVar77._0_16_);
            in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            (*local_5d88->occlusionFilterN)(&local_5d80);
          }
          if (local_5ce0 == (undefined1  [32])0x0) {
            uVar40 = 0;
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar81 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar82 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar83 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar84 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar85 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar86 = ZEXT3264(auVar41);
          }
          else {
            p_Var5 = local_5da8->args->filter;
            if (p_Var5 == (RTCFilterFunctionN)0x0) {
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar81 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar82 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar83 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar84 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar85 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar86 = ZEXT3264(auVar41);
            }
            else {
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar81 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar82 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar83 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar84 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar85 = ZEXT3264(auVar41);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar86 = ZEXT3264(auVar41);
              if (((local_5da8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_5d88->field_8).field_0x2 & 0x40) != 0)
                 ) {
                auVar77 = ZEXT1664(auVar77._0_16_);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                (*p_Var5)(&local_5d80);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar86 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar85 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar84 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar83 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar82 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar81 = ZEXT3264(auVar41);
              }
            }
            uVar40 = vptestmd_avx512vl(local_5ce0,local_5ce0);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar28 = (bool)((byte)uVar40 & 1);
            auVar43._0_4_ =
                 (uint)bVar28 * auVar41._0_4_ | (uint)!bVar28 * *(int *)(local_5d80.ray + 0x100);
            bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar43._4_4_ =
                 (uint)bVar28 * auVar41._4_4_ |
                 (uint)!bVar28 * *(int *)((RayK<8> *)(local_5d80.ray + 0x100) + 4);
            bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar43._8_4_ =
                 (uint)bVar28 * auVar41._8_4_ |
                 (uint)!bVar28 * *(int *)((RayK<8> *)(local_5d80.ray + 0x100) + 8);
            bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar43._12_4_ =
                 (uint)bVar28 * auVar41._12_4_ |
                 (uint)!bVar28 * *(int *)((RayK<8> *)(local_5d80.ray + 0x100) + 0xc);
            bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar43._16_4_ =
                 (uint)bVar28 * auVar41._16_4_ |
                 (uint)!bVar28 * *(int *)((RayK<8> *)(local_5d80.ray + 0x100) + 0x10);
            bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar43._20_4_ =
                 (uint)bVar28 * auVar41._20_4_ |
                 (uint)!bVar28 * *(int *)((RayK<8> *)(local_5d80.ray + 0x100) + 0x14);
            bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar43._24_4_ =
                 (uint)bVar28 * auVar41._24_4_ |
                 (uint)!bVar28 * *(int *)((RayK<8> *)(local_5d80.ray + 0x100) + 0x18);
            bVar28 = SUB81(uVar40 >> 7,0);
            auVar43._28_4_ =
                 (uint)bVar28 * auVar41._28_4_ |
                 (uint)!bVar28 * *(int *)((RayK<8> *)(local_5d80.ray + 0x100) + 0x1c);
            *(undefined1 (*) [32])(local_5d80.ray + 0x100) = auVar43;
          }
          bVar26 = (byte)uVar40;
          auVar60._0_4_ =
               (uint)(bVar26 & 1) * *(int *)local_5d90 |
               (uint)!(bool)(bVar26 & 1) * local_5d20._0_4_;
          bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
          auVar60._4_4_ = (uint)bVar28 * *(int *)(local_5d90 + 4) | (uint)!bVar28 * local_5d20._4_4_
          ;
          bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
          auVar60._8_4_ = (uint)bVar28 * *(int *)(local_5d90 + 8) | (uint)!bVar28 * local_5d20._8_4_
          ;
          bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
          auVar60._12_4_ =
               (uint)bVar28 * *(int *)(local_5d90 + 0xc) | (uint)!bVar28 * local_5d20._12_4_;
          bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
          auVar60._16_4_ =
               (uint)bVar28 * *(int *)(local_5d90 + 0x10) | (uint)!bVar28 * local_5d20._16_4_;
          bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
          auVar60._20_4_ =
               (uint)bVar28 * *(int *)(local_5d90 + 0x14) | (uint)!bVar28 * local_5d20._20_4_;
          bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
          auVar60._24_4_ =
               (uint)bVar28 * *(int *)(local_5d90 + 0x18) | (uint)!bVar28 * local_5d20._24_4_;
          bVar28 = SUB81(uVar40 >> 7,0);
          auVar60._28_4_ =
               (uint)bVar28 * *(int *)(local_5d90 + 0x1c) | (uint)!bVar28 * local_5d20._28_4_;
          *(undefined1 (*) [32])local_5d90 = auVar60;
          ray = local_5db0;
          uVar40 = local_5db8;
          context = local_5da8;
        }
        uVar30 = (uint)(bVar27 & ~bVar26);
      }
      lVar37 = lVar37 + 1;
      lVar31 = local_5d00._0_8_;
    } while ((char)uVar30 != '\0');
    bVar27 = 0;
LAB_01dd5b49:
    lVar32 = local_5d38 + 1;
    lVar31 = lVar31 + 0x50;
    bVar27 = (byte)local_5d98 & bVar27;
    uVar30 = CONCAT31((int3)(local_5d98 >> 8),bVar27);
  } while (bVar27 != 0);
  uVar30 = 0;
LAB_01dd5b67:
  bVar27 = (byte)local_5dcc | ~(byte)uVar30;
  local_5dcc = (uint)bVar27;
  if (bVar27 == 0xff) {
    local_5dcc = 0xff;
    goto LAB_01dd5cb7;
  }
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5b00._0_4_ =
       (uint)(bVar27 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar27 & 1) * local_5b00._0_4_;
  bVar28 = (bool)(bVar27 >> 1 & 1);
  local_5b00._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * local_5b00._4_4_;
  bVar28 = (bool)(bVar27 >> 2 & 1);
  local_5b00._8_4_ = (uint)bVar28 * auVar41._8_4_ | (uint)!bVar28 * local_5b00._8_4_;
  bVar28 = (bool)(bVar27 >> 3 & 1);
  local_5b00._12_4_ = (uint)bVar28 * auVar41._12_4_ | (uint)!bVar28 * local_5b00._12_4_;
  bVar28 = (bool)(bVar27 >> 4 & 1);
  local_5b00._16_4_ = (uint)bVar28 * auVar41._16_4_ | (uint)!bVar28 * local_5b00._16_4_;
  bVar28 = (bool)(bVar27 >> 5 & 1);
  local_5b00._20_4_ = (uint)bVar28 * auVar41._20_4_ | (uint)!bVar28 * local_5b00._20_4_;
  bVar28 = (bool)(bVar27 >> 6 & 1);
  local_5b00._24_4_ = (uint)bVar28 * auVar41._24_4_ | (uint)!bVar28 * local_5b00._24_4_;
  local_5b00._28_4_ =
       (uint)(bVar27 >> 7) * auVar41._28_4_ | (uint)!(bool)(bVar27 >> 7) * local_5b00._28_4_;
  goto LAB_01dd5077;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }